

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FragmentOutputCase::~FragmentOutputCase(FragmentOutputCase *this)

{
  pointer puVar1;
  pointer pFVar2;
  pointer pBVar3;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FragmentOutputCase_0219be48;
  deinit(this);
  puVar1 = (this->m_renderbuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_renderbuffers).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pFVar2 = (this->m_outputs).
           super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pFVar2 != (pointer)0x0) {
    operator_delete(pFVar2,(long)(this->m_outputs).
                                 super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar2);
  }
  pBVar3 = (this->m_fboSpec).
           super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pBVar3 != (pointer)0x0) {
    operator_delete(pBVar3,(long)(this->m_fboSpec).
                                 super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pBVar3);
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

FragmentOutputCase::~FragmentOutputCase (void)
{
	deinit();
}